

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_window.cpp
# Opt level: O0

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalWindow *window,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  bool bVar1;
  long in_RDX;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> in_RDI;
  BoundOrderByNode *bound_order_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<duckdb::BoundOrderByNode,_true> *__range2_2;
  BoundOrderByNode *bound_order;
  iterator __end2_1;
  iterator __begin2_1;
  vector<duckdb::BoundOrderByNode,_true> *__range2_1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range2;
  BoundWindowExpression *over_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *window_expr;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  *in_stack_fffffffffffffe38;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
  *in_stack_fffffffffffffe40;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_fffffffffffffe50;
  StatisticsPropagator *in_stack_fffffffffffffe58;
  BaseExpression *in_stack_fffffffffffffe80;
  StatisticsPropagator *in_stack_fffffffffffffe88;
  __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
  local_100;
  vector<duckdb::BoundOrderByNode,_true> *local_f8;
  undefined1 local_d0 [56];
  __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
  local_98;
  vector<duckdb::BoundOrderByNode,_true> *local_90;
  reference local_70;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_68;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_60;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_58;
  BoundWindowExpression *local_50;
  reference local_48;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_40;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_38;
  long local_30;
  long local_18;
  
  local_18 = in_RDX;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  PropagateStatistics(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::operator=
            ((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
              *)in_stack_fffffffffffffe40,
             (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
              *)in_stack_fffffffffffffe38);
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::~unique_ptr
            ((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
              *)0x19d5ccd);
  local_30 = local_18 + 0x28;
  local_38._M_current =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)in_stack_fffffffffffffe38);
  local_40 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             ::std::
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
               ::operator*(&local_38);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe40);
    local_50 = BaseExpression::Cast<duckdb::BoundWindowExpression>(in_stack_fffffffffffffe80);
    local_58 = &local_50->partitions;
    local_60._M_current =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
         ::std::
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe38);
    local_68 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               ::std::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)in_stack_fffffffffffffe38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                          *)in_stack_fffffffffffffe40,
                         (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                          *)in_stack_fffffffffffffe38);
      if (!bVar1) break;
      local_70 = __gnu_cxx::
                 __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                 ::operator*(&local_60);
      PropagateExpression(in_stack_fffffffffffffe88,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe80);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d5e2d);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator++(&local_60);
    }
    local_90 = &local_50->orders;
    local_98._M_current =
         (BoundOrderByNode *)
         ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::begin
                   (in_stack_fffffffffffffe38);
    local_d0._48_8_ =
         ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::end
                   (in_stack_fffffffffffffe38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                          *)in_stack_fffffffffffffe40,
                         (__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                          *)in_stack_fffffffffffffe38);
      if (!bVar1) break;
      local_d0._40_8_ =
           __gnu_cxx::
           __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
           ::operator*(&local_98);
      PropagateExpression(in_stack_fffffffffffffe88,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe80);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      operator=((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 *)in_stack_fffffffffffffe40,
                (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d5f1c);
      __gnu_cxx::
      __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
      ::operator++(&local_98);
    }
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0x19d5f42);
    if (bVar1) {
      PropagateExpression(in_stack_fffffffffffffe88,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe80);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d5fa6);
    }
    else {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d6018);
    }
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0x19d6054);
    if (bVar1) {
      PropagateExpression(in_stack_fffffffffffffe88,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe80);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d60b2);
    }
    else {
      in_stack_fffffffffffffe80 = (BaseExpression *)&local_50->expr_stats;
      in_stack_fffffffffffffe88 = (StatisticsPropagator *)local_d0;
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d6124);
    }
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0x19d6160);
    if (bVar1) {
      PropagateExpression(in_stack_fffffffffffffe88,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe80);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d61be);
    }
    else {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d6230);
    }
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0x19d626c);
    if (bVar1) {
      PropagateExpression(in_stack_fffffffffffffe88,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe80);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d62ca);
    }
    else {
      in_stack_fffffffffffffe40 = &local_50->expr_stats;
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::push_back(&in_stack_fffffffffffffe40->
                   super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ,(value_type *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d633c);
    }
    local_f8 = &local_50->arg_orders;
    local_100._M_current =
         (BoundOrderByNode *)
         ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::begin
                   (in_stack_fffffffffffffe38);
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::end
              (in_stack_fffffffffffffe38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                          *)in_stack_fffffffffffffe40,
                         (__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                          *)in_stack_fffffffffffffe38);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
      ::operator*(&local_100);
      PropagateExpression(in_stack_fffffffffffffe88,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe80);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      operator=((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 *)in_stack_fffffffffffffe40,
                (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 *)in_stack_fffffffffffffe38);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0x19d641b);
      __gnu_cxx::
      __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
      ::operator++(&local_100);
    }
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator++(&local_38);
  }
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::unique_ptr
            ((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
              *)in_stack_fffffffffffffe40,
             (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
              *)in_stack_fffffffffffffe38);
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
         .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalWindow &window,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// first propagate to the child
	node_stats = PropagateStatistics(window.children[0]);

	// then propagate to each of the order expressions
	for (auto &window_expr : window.expressions) {
		auto &over_expr = window_expr->Cast<BoundWindowExpression>();
		for (auto &expr : over_expr.partitions) {
			over_expr.partitions_stats.push_back(PropagateExpression(expr));
		}
		for (auto &bound_order : over_expr.orders) {
			bound_order.stats = PropagateExpression(bound_order.expression);
		}

		if (over_expr.start_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.start_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}

		if (over_expr.end_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.end_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}

		if (over_expr.offset_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.offset_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}

		if (over_expr.default_expr) {
			over_expr.expr_stats.push_back(PropagateExpression(over_expr.default_expr));
		} else {
			over_expr.expr_stats.push_back(nullptr);
		}
		for (auto &bound_order : over_expr.arg_orders) {
			bound_order.stats = PropagateExpression(bound_order.expression);
		}
	}
	return std::move(node_stats);
}